

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O3

void __thiscall
QBlitterPaintEnginePrivate::fillRect
          (QBlitterPaintEnginePrivate *this,QRectF *rect,QColor *color,bool alpha)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QPaintEngine *this_00;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  qreal qVar7;
  qreal qVar8;
  byte bVar9;
  int iVar10;
  CompositionMode CVar11;
  QPaintEngine *pQVar12;
  QRect *this_01;
  const_iterator pQVar13;
  QBlittable *pQVar14;
  QPaintDevice *pQVar15;
  _func_int **pp_Var16;
  int iVar17;
  QClipData *pQVar18;
  QPaintEngineState *pQVar19;
  QRectF *pQVar20;
  QRect *rect_1;
  long in_FS_OFFSET;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  QRectF local_98;
  QRectF local_78;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QRasterPaintEnginePrivate).super_QPaintEngineExPrivate.
            super_QPaintEnginePrivate.q_ptr;
  local_58.xp = rect->xp;
  local_58.yp = rect->yp;
  local_58.w = rect->w;
  local_58.h = rect->h;
  pQVar12 = this_00;
  if (this->hasXForm != 0) {
    pQVar19 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar19 = (QPaintEngineState *)0x0;
    }
    QTransform::mapRect(&local_58,(QTransform *)(pQVar19 + 0x36),rect);
    pQVar12 = (this->super_QRasterPaintEnginePrivate).super_QPaintEngineExPrivate.
              super_QPaintEnginePrivate.q_ptr;
  }
  qVar7 = local_58.w;
  if (((pQVar12->state == (QPaintEngineState *)0x0) ||
      (pQVar18 = *(QClipData **)(pQVar12->state + 0x100), pQVar18 == (QClipData *)0x0)) ||
     (bVar9 = pQVar18->field_0x48, (bVar9 & 1) == 0)) {
    pQVar18 = (this->super_QRasterPaintEnginePrivate).baseClip.d;
    if (pQVar18 != (QClipData *)0x0) {
      bVar9 = pQVar18->field_0x48;
      goto LAB_003b3356;
    }
    if ((local_58.xp < 0.0) || (local_58.yp < 0.0)) {
LAB_003b373e:
      pQVar15 = QPaintEngine::paintDevice(this_00);
      iVar10 = (*pQVar15->_vptr_QPaintDevice[4])(pQVar15,1);
      pQVar15 = QPaintEngine::paintDevice(this_00);
      iVar17 = (*pQVar15->_vptr_QPaintDevice[4])(pQVar15,2);
      local_78.h = (qreal)iVar17;
      local_78.xp = 0.0;
      local_78.yp = 0.0;
      local_78.w = (double)iVar10;
      pQVar14 = QBlittablePlatformPixmap::blittable(this->pmData);
      QBlittable::unlock(pQVar14);
      pQVar14 = QBlittablePlatformPixmap::blittable(this->pmData);
      if (alpha) {
        pQVar20 = &local_98;
        QRectF::operator&(pQVar20,&local_78);
        pQVar19 = this_00->state + -2;
        if (this_00->state == (QPaintEngineState *)0x0) {
          pQVar19 = (QPaintEngineState *)0x0;
        }
        CVar11 = QPaintEngineState::compositionMode(pQVar19 + 2);
        pp_Var16 = pQVar14->_vptr_QBlittable;
        goto LAB_003b3801;
      }
      pQVar20 = &local_98;
      QRectF::operator&(pQVar20,&local_78);
      pp_Var16 = pQVar14->_vptr_QBlittable;
      goto LAB_003b38a5;
    }
    pQVar15 = QPaintEngine::paintDevice(this_00);
    iVar10 = (*pQVar15->_vptr_QPaintDevice[4])(pQVar15,1);
    qVar8 = local_58.h;
    if ((double)iVar10 < qVar7) goto LAB_003b373e;
    pQVar15 = QPaintEngine::paintDevice(this_00);
    iVar10 = (*pQVar15->_vptr_QPaintDevice[4])(pQVar15,2);
    if ((double)iVar10 < qVar8) goto LAB_003b373e;
    pQVar14 = QBlittablePlatformPixmap::blittable(this->pmData);
    QBlittable::unlock(pQVar14);
    pQVar14 = QBlittablePlatformPixmap::blittable(this->pmData);
    if (!alpha) {
      pp_Var16 = pQVar14->_vptr_QBlittable;
      pQVar20 = &local_58;
      goto LAB_003b38a5;
    }
    pQVar19 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar19 = (QPaintEngineState *)0x0;
    }
    CVar11 = QPaintEngineState::compositionMode(pQVar19 + 2);
    pp_Var16 = pQVar14->_vptr_QBlittable;
    pQVar20 = &local_58;
  }
  else {
LAB_003b3356:
    if ((bVar9 & 2) == 0) {
      if ((bVar9 & 4) != 0) {
        this_01 = QRegion::begin(&pQVar18->clipRegion);
        pQVar13 = QRegion::end(&pQVar18->clipRegion);
        for (; this_01 != pQVar13; this_01 = this_01 + 1) {
          dVar21 = (double)((ulong)local_58.xp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_58.xp;
          bVar5 = 2147483647.0 < dVar21;
          if (dVar21 <= -2147483648.0) {
            dVar21 = -2147483648.0;
          }
          dVar21 = (double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar21);
          iVar10 = (int)dVar21;
          dVar22 = (double)((ulong)local_58.yp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_58.yp;
          bVar5 = 2147483647.0 < dVar22;
          if (dVar22 <= -2147483648.0) {
            dVar22 = -2147483648.0;
          }
          dVar22 = (double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar22);
          iVar17 = (int)dVar22;
          dVar21 = (local_58.xp - (double)(int)dVar21) * 0.5 + local_58.w;
          dVar21 = (double)((ulong)dVar21 & 0x8000000000000000 | 0x3fe0000000000000) + dVar21;
          bVar5 = 2147483647.0 < dVar21;
          if (dVar21 <= -2147483648.0) {
            dVar21 = -2147483648.0;
          }
          dVar22 = (local_58.yp - (double)(int)dVar22) * 0.5 + local_58.h;
          dVar22 = (double)((ulong)dVar22 & 0x8000000000000000 | 0x3fe0000000000000) + dVar22;
          bVar6 = 2147483647.0 < dVar22;
          if (dVar22 <= -2147483648.0) {
            dVar22 = -2147483648.0;
          }
          local_78.xp = (qreal)CONCAT44(iVar17,iVar10);
          local_78.yp = (qreal)CONCAT44((int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 |
                                                     ~-(ulong)bVar6 & (ulong)dVar22) + iVar17 + -1,
                                        (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 |
                                                     ~-(ulong)bVar5 & (ulong)dVar21) + iVar10 + -1);
          auVar23 = QRect::operator&(this_01,(QRect *)&local_78);
          iVar10 = auVar23._0_4_;
          if (auVar23._4_4_ <= auVar23._12_4_ && iVar10 <= auVar23._8_4_) {
            pQVar14 = QBlittablePlatformPixmap::blittable(this->pmData);
            QBlittable::unlock(pQVar14);
            pQVar14 = QBlittablePlatformPixmap::blittable(this->pmData);
            local_78.xp = (qreal)iVar10;
            local_78.yp = (qreal)auVar23._4_4_;
            local_78.w = (qreal)(((long)auVar23._8_4_ - (long)iVar10) + 1);
            local_78.h = (qreal)(((auVar23._8_8_ >> 0x20) - (auVar23._0_8_ >> 0x20)) + 1);
            if (alpha) {
              pQVar19 = this_00->state + -2;
              if (this_00->state == (QPaintEngineState *)0x0) {
                pQVar19 = (QPaintEngineState *)0x0;
              }
              CVar11 = QPaintEngineState::compositionMode(pQVar19 + 2);
              (*pQVar14->_vptr_QBlittable[4])(pQVar14,&local_78,color,(ulong)CVar11);
            }
            else {
              (*pQVar14->_vptr_QBlittable[2])(pQVar14,&local_78,color);
            }
          }
        }
      }
      goto LAB_003b38ad;
    }
    pQVar14 = QBlittablePlatformPixmap::blittable(this->pmData);
    QBlittable::unlock(pQVar14);
    pQVar14 = QBlittablePlatformPixmap::blittable(this->pmData);
    if (!alpha) {
      uVar2 = (pQVar18->clipRect).x1;
      uVar4 = (pQVar18->clipRect).y1;
      local_98.xp = (qreal)(int)uVar2;
      local_98.yp = (qreal)(int)uVar4;
      local_98.w = (qreal)(((long)(pQVar18->clipRect).x2.m_i - (long)(int)uVar2) + 1);
      local_98.h = (qreal)(((long)(pQVar18->clipRect).y2.m_i - (long)(int)uVar4) + 1);
      pQVar20 = &local_78;
      QRectF::operator&(pQVar20,&local_58);
      pp_Var16 = pQVar14->_vptr_QBlittable;
LAB_003b38a5:
      (*pp_Var16[2])(pQVar14,pQVar20,color);
      goto LAB_003b38ad;
    }
    uVar1 = (pQVar18->clipRect).x1;
    uVar3 = (pQVar18->clipRect).y1;
    local_98.xp = (qreal)(int)uVar1;
    local_98.yp = (qreal)(int)uVar3;
    local_98.w = (qreal)(((long)(pQVar18->clipRect).x2.m_i - (long)(int)uVar1) + 1);
    local_98.h = (qreal)(((long)(pQVar18->clipRect).y2.m_i - (long)(int)uVar3) + 1);
    pQVar20 = &local_78;
    QRectF::operator&(pQVar20,&local_58);
    pQVar19 = this_00->state + -2;
    if (this_00->state == (QPaintEngineState *)0x0) {
      pQVar19 = (QPaintEngineState *)0x0;
    }
    CVar11 = QPaintEngineState::compositionMode(pQVar19 + 2);
    pp_Var16 = pQVar14->_vptr_QBlittable;
  }
LAB_003b3801:
  (*pp_Var16[4])(pQVar14,pQVar20,color,(ulong)CVar11);
LAB_003b38ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBlitterPaintEnginePrivate::fillRect(const QRectF &rect, const QColor &color, bool alpha)
{
    Q_Q(QBlitterPaintEngine);
    pmData->unmarkRasterOverlay(rect);
    QRectF targetRect = rect;
    if (hasXForm)
        targetRect = q->state()->matrix.mapRect(rect);
    const QClipData *clipData = clip();
    if (clipData) {
        if (clipData->hasRectClip) {
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(targetRect & clipData->clipRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(targetRect & clipData->clipRect, color);
        } else if (clipData->hasRegionClip) {
            for (const QRect &rect : clipData->clipRegion) {
                QRect intersectRect = rect.intersected(targetRect.toRect());
                if (!intersectRect.isEmpty()) {
                    unlock();
                    if (alpha)
                        pmData->blittable()->alphaFillRect(intersectRect, color, q->state()->compositionMode());
                    else
                        pmData->blittable()->fillRect(intersectRect, color);
                }
            }
        }
    } else {
        if (targetRect.x() >= 0 && targetRect.y() >= 0
            && targetRect.width() <= q->paintDevice()->width()
            && targetRect.height() <= q->paintDevice()->height()) {
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(targetRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(targetRect, color);
        } else {
            QRectF deviceRect(0, 0, q->paintDevice()->width(), q->paintDevice()->height());
            unlock();
            if (alpha)
                pmData->blittable()->alphaFillRect(deviceRect & targetRect, color, q->state()->compositionMode());
            else
                pmData->blittable()->fillRect(deviceRect & targetRect, color);
        }
    }
}